

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

void __thiscall Liby::Connection::destroy(Connection *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Manager_type p_Var2;
  Logger *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  
  if (this->destroy_ == false) {
    this->destroy_ = true;
    this_00 = Logger::getLogger();
    Logger::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    p_Var1 = (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    p_Var1 = (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::clear(&this->writTasks_);
    p_Var2 = (this->erroEventCallback_).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->erroEventCallback_,(_Any_data *)&this->erroEventCallback_,
                __destroy_functor);
      (this->erroEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->erroEventCallback_)._M_invoker = (_Invoker_type)0x0;
    }
    p_Var2 = (this->readEventCallback_).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->readEventCallback_,(_Any_data *)&this->readEventCallback_,
                __destroy_functor);
      (this->readEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->readEventCallback_)._M_invoker = (_Invoker_type)0x0;
    }
    p_Var1 = (this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      return;
    }
  }
  return;
}

Assistant:

void Connection::destroy() {
    if (destroy_)
        return;
    else
        destroy_ = true;
    verbose("try to destroy connection %p", this);
    chan_.reset();
    socket_.reset();
    writTasks_.clear();
    erroEventCallback_ = nullptr;
    readEventCallback_ = nullptr;
    self_.reset();
}